

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[24],char_const(&)[7],kj::String,char_const(&)[3],char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,char (*params) [24],char (*params_1) [7],
          String *params_2,char (*params_3) [3],char (*params_4) [3])

{
  char (*value) [24];
  char (*value_00) [7];
  String *value_01;
  char (*pacVar1) [3];
  String *params_4_00;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  char (*local_38) [3];
  char (*params_local_4) [3];
  char (*params_local_3) [3];
  String *params_local_2;
  char (*params_local_1) [7];
  char (*params_local) [24];
  
  params_4_00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = (char (*) [3])params_2;
  params_local_3 = (char (*) [3])params_1;
  params_local_2 = (String *)params;
  params_local_1 = (char (*) [7])this;
  params_local = (char (*) [24])__return_storage_ptr__;
  value = ::const((char (*) [24])this);
  local_48 = toCharSequence<char_const(&)[24]>(value);
  value_00 = ::const((char (*) [7])params_local_2);
  local_58 = toCharSequence<char_const(&)[7]>(value_00);
  value_01 = fwd<kj::String>((NoInfer<kj::String> *)params_local_3);
  local_68 = toCharSequence<kj::String>(value_01);
  pacVar1 = ::const(params_local_4);
  local_78 = toCharSequence<char_const(&)[3]>(pacVar1);
  pacVar1 = ::const(local_38);
  local_88 = toCharSequence<char_const(&)[3]>(pacVar1);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_4_00,(_ *)&local_48,&local_58,&local_68,&local_78,&local_88,
             (ArrayPtr<const_char> *)params_4_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}